

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
::rebalance_left_to_right
          (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
           *this,int to_move,
          btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
          *right,allocator_type *alloc)

{
  int iVar1;
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  bVar2;
  ulong uVar3;
  bool bVar4;
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  *pbVar5;
  char *__function;
  uint uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int i;
  
  if ((((ulong)this & 7) != 0) || (((ulong)right & 7) != 0)) {
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
    goto LAB_001a7761;
  }
  if (*(long *)this != *(long *)right) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x627,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>]"
                 );
  }
  if ((byte)this[8] + 1 != (uint)(byte)right[8]) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x628,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>]"
                 );
  }
  bVar2 = right[10];
  if ((byte)this[10] < (byte)bVar2) {
    __assert_fail("count() >= right->count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x629,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>]"
                 );
  }
  if (to_move < 1) {
    __assert_fail("to_move >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x62a,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>]"
                 );
  }
  if ((int)(uint)(byte)this[10] < to_move) {
    __assert_fail("to_move <= count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x62b,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>]"
                 );
  }
  if ((int)(uint)(byte)bVar2 < to_move) {
    uninitialized_move_n(right,(ulong)(byte)bVar2,0,(ulong)(uint)to_move,right,alloc);
    uVar3 = *(ulong *)this;
    if ((uVar3 & 7) == 0) {
      bVar2 = this[8];
      uVar6 = to_move - 1;
      *(undefined4 *)(right + (ulong)uVar6 * 0xc + 0x14) =
           *(undefined4 *)(uVar3 + 0x14 + (ulong)(byte)bVar2 * 0xc);
      *(undefined8 *)(right + (ulong)uVar6 * 0xc + 0xc) =
           *(undefined8 *)(uVar3 + 0xc + (ulong)(byte)bVar2 * 0xc);
      bVar2 = right[10];
      iVar9 = ~(uint)(byte)bVar2 + to_move;
      uninitialized_move_n
                (this,(long)iVar9,(ulong)(byte)this[10] - (long)iVar9,(ulong)(byte)bVar2,right,alloc
                );
      if ((ulong)(byte)bVar2 != 0) {
        bVar2 = this[10];
        lVar7 = 0xc;
        do {
          pbVar5 = this + lVar7 + (ulong)(byte)bVar2 * 0xc + (long)(int)uVar6 * -0xc;
          *(undefined8 *)(right + lVar7) = *(undefined8 *)pbVar5;
          *(undefined4 *)(right + lVar7 + 8) = *(undefined4 *)(pbVar5 + 8);
          lVar7 = lVar7 + 0xc;
        } while (pbVar5 + 0xc != this + (long)(int)((uint)(byte)bVar2 - iVar9) * 0xc + 0xc);
      }
LAB_001a7646:
      uVar3 = *(ulong *)this;
      if ((uVar3 & 7) == 0) {
        bVar2 = this[8];
        lVar7 = (ulong)(byte)this[10] - (long)to_move;
        *(undefined8 *)(uVar3 + 0xc + (ulong)(byte)bVar2 * 0xc) =
             *(undefined8 *)(this + lVar7 * 0xc + 0xc);
        *(undefined4 *)(uVar3 + 0x14 + (ulong)(byte)bVar2 * 0xc) =
             *(undefined4 *)(this + lVar7 * 0xc + 0x14);
        if (this[0xb] ==
            (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
             )0x0) {
          uVar6 = (uint)(byte)right[10];
          do {
            pbVar5 = child(right,uVar6);
            init_child(right,to_move + uVar6,pbVar5);
            mutable_child(right,uVar6);
            bVar4 = 0 < (int)uVar6;
            uVar6 = uVar6 - 1;
          } while (bVar4);
          iVar9 = 1;
          if (1 < to_move) {
            iVar9 = to_move;
          }
          i = 0;
          do {
            iVar1 = i + (1 - to_move);
            pbVar5 = child(this,(uint)(byte)this[10] + iVar1);
            init_child(right,i,pbVar5);
            mutable_child(this,(uint)(byte)this[10] + iVar1);
            i = i + 1;
          } while (iVar9 != i);
        }
        this[10] = (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                    )((char)this[10] - (char)to_move);
        right[10] = (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                     )((char)right[10] + (char)to_move);
        return;
      }
    }
  }
  else {
    uninitialized_move_n
              (right,(ulong)(uint)to_move,(long)(int)((uint)(byte)bVar2 - to_move),
               (ulong)(byte)bVar2,right,alloc);
    uVar6 = ~to_move + (uint)(byte)right[10];
    if (-1 < (int)uVar6) {
      lVar7 = (ulong)uVar6 * 0xc + 0x18;
      pbVar5 = right + (ulong)(byte)right[10] * 0xc + 8;
      do {
        *(undefined8 *)(pbVar5 + -8) = *(undefined8 *)(right + lVar7 + -0xc);
        *(undefined4 *)pbVar5 = *(undefined4 *)(right + lVar7 + -4);
        lVar7 = lVar7 + -0xc;
        pbVar5 = pbVar5 + -0xc;
      } while (0x17 < lVar7);
    }
    uVar3 = *(ulong *)this;
    if ((uVar3 & 7) == 0) {
      bVar2 = this[8];
      lVar7 = (long)to_move + -1;
      lVar8 = (long)(int)lVar7;
      *(undefined8 *)(right + lVar8 * 0xc + 0xc) =
           *(undefined8 *)(uVar3 + 0xc + (ulong)(byte)bVar2 * 0xc);
      *(undefined4 *)(right + lVar8 * 0xc + 0x14) =
           *(undefined4 *)(uVar3 + 0x14 + (ulong)(byte)bVar2 * 0xc);
      if (lVar7 != 0) {
        bVar2 = this[10];
        lVar7 = 0xc;
        do {
          pbVar5 = this + lVar7 + (ulong)(byte)bVar2 * 0xc + lVar8 * -0xc;
          *(undefined8 *)(right + lVar7) = *(undefined8 *)pbVar5;
          *(undefined4 *)(right + lVar7 + 8) = *(undefined4 *)(pbVar5 + 8);
          lVar7 = lVar7 + 0xc;
        } while (pbVar5 + 0xc != this + (ulong)(byte)bVar2 * 0xc + 0xc);
      }
      goto LAB_001a7646;
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
  ;
LAB_001a7761:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,__function);
}

Assistant:

void btree_node<P>::rebalance_left_to_right(const int to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(count() >= right->count());
  assert(to_move >= 1);
  assert(to_move <= count());

  // Values in the right node are shifted to the right to make room for the
  // new to_move values. Then, the delimiting value in the parent and the
  // other (to_move - 1) values in the left node are moved into the right node.
  // Lastly, a new delimiting value is moved from the left node into the
  // parent, and the remaining empty left node entries are destroyed.

  if (right->count() >= to_move) {
    // The original location of the right->count() values are sufficient to hold
    // the new to_move entries from the parent and left node.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(to_move, right->count() - to_move,
                                right->count(), right, alloc);
    for (slot_type *src = right->slot(right->count() - to_move - 1),
                   *dest = right->slot(right->count() - 1),
                   *end = right->slot(0);
         src >= end; --src, --dest) {
      slot_type::move(alloc, src, dest);
    }

    // 2) Move the delimiting value in the parent to the right node.
    slot_type::move(alloc, parent()->slot(position()),
                    right->slot(to_move - 1));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    slot_type::move(alloc, slot(count() - (to_move - 1)), slot(count()),
                    right->slot(0));
  } else {
    // The right node does not have enough initialized space to hold the new
    // to_move entries, so part of them will move to uninitialized space.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(right->count(), 0, to_move, right, alloc);

    // 2) Move the delimiting value in the parent to the right node.
    right->value_init(to_move - 1, alloc, parent()->slot(position()));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    const size_type uninitialized_remaining = to_move - right->count() - 1;
    uninitialized_move_n(uninitialized_remaining,
                         count() - uninitialized_remaining, right->count(),
                         right, alloc);
    slot_type::move(alloc, slot(count() - (to_move - 1)),
                    slot(count() - uninitialized_remaining), right->slot(0));
  }

  // 4) Move the new delimiting value to the parent from the left node.
  slot_type::move(alloc, slot(count() - to_move), parent()->slot(position()));

  // 5) Destroy the now-empty to_move entries in the left node.
  value_destroy_n(count() - to_move, to_move, alloc);

  if (!leaf()) {
    // Move the child pointers from the left to the right node.
    for (int i = right->count(); i >= 0; --i) {
      right->init_child(i + to_move, right->child(i));
      right->clear_child(i);
    }
    for (int i = 1; i <= to_move; ++i) {
      right->init_child(i - 1, child(count() - to_move + i));
      clear_child(count() - to_move + i);
    }
  }

  // Fixup the counts on the left and right nodes.
  set_count(count() - to_move);
  right->set_count(right->count() + to_move);
}